

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::UnmapTextureSubresource
          (DeviceContextVkImpl *this,ITexture *pTexture,Uint32 MipLevel,Uint32 ArraySlice)

{
  undefined *puVar1;
  bool bVar2;
  CPU_ACCESS_FLAGS CVar3;
  TextureVkImpl *DstTextureVk;
  pointer ppVar4;
  VkBuffer vkSrcBuffer;
  undefined8 uVar5;
  Char *Message;
  char (*Args_1) [56];
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  Char *local_c0;
  undefined1 local_b8 [8];
  string msg;
  undefined1 local_88 [8];
  string _msg;
  MappedTexture *MappedTex;
  key_type local_48;
  _Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
  local_38;
  iterator UploadSpaceIt;
  TextureDesc *TexDesc;
  TextureVkImpl *TextureVk;
  Uint32 ArraySlice_local;
  Uint32 MipLevel_local;
  ITexture *pTexture_local;
  DeviceContextVkImpl *this_local;
  
  Args_1 = (char (*) [56])(ulong)ArraySlice;
  TextureVk._0_4_ = ArraySlice;
  TextureVk._4_4_ = MipLevel;
  _ArraySlice_local = pTexture;
  pTexture_local = (ITexture *)this;
  DeviceContextBase<Diligent::EngineVkImplTraits>::UnmapTextureSubresource
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pTexture,MipLevel,ArraySlice);
  DstTextureVk = ClassPtrCast<Diligent::TextureVkImpl,Diligent::ITexture>(_ArraySlice_local);
  UploadSpaceIt.
  super__Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
             )DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
              ::GetDesc((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                         *)DstTextureVk);
  if ((((__node_type *)
       UploadSpaceIt.
       super__Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
       ._M_cur)->
      super__Hash_node_value<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
      ).
      super__Hash_node_value_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>_>
      ._M_storage._M_storage.__data[0x20] == USAGE_DYNAMIC) {
    local_48.MipLevel = TextureVk._4_4_;
    local_48.ArraySlice = (Uint32)TextureVk;
    local_48.Texture = DstTextureVk;
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture,_Diligent::DeviceContextVkImpl::MappedTextureKey::Hasher,_std::equal_to<Diligent::DeviceContextVkImpl::MappedTextureKey>,_std::allocator<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>_>_>
         ::find(&this->m_MappedTextures,&local_48);
    MappedTex = (MappedTexture *)
                std::
                unordered_map<Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture,_Diligent::DeviceContextVkImpl::MappedTextureKey::Hasher,_std::equal_to<Diligent::DeviceContextVkImpl::MappedTextureKey>,_std::allocator<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>_>_>
                ::end(&this->m_MappedTextures);
    bVar2 = std::__detail::operator!=
                      (&local_38,
                       (_Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
                        *)&MappedTex);
    if (bVar2) {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false,_false>
                             *)&local_38);
      vkSrcBuffer = VulkanDynamicMemoryManager::GetVkBuffer
                              ((ppVar4->second).Allocation.pDynamicMemMgr);
      CopyBufferToTexture(this,vkSrcBuffer,(ppVar4->second).Allocation.AlignedOffset,
                          (ppVar4->second).CopyInfo.RowStrideInTexels,DstTextureVk,
                          &(ppVar4->second).CopyInfo.Region,TextureVk._4_4_,(Uint32)TextureVk,
                          RESOURCE_STATE_TRANSITION_MODE_TRANSITION);
      std::
      unordered_map<Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture,_Diligent::DeviceContextVkImpl::MappedTextureKey::Hasher,_std::equal_to<Diligent::DeviceContextVkImpl::MappedTextureKey>,_std::allocator<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>_>_>
      ::erase(&this->m_MappedTextures,(iterator)local_38._M_cur);
    }
    else {
      FormatString<char[27],unsigned_int,char[9],unsigned_int,char[14],char_const*,char[71]>
                ((string *)local_88,(Diligent *)"Failed to unmap mip level ",
                 (char (*) [27])((long)&TextureVk + 4),(uint *)", slice ",(char (*) [9])&TextureVk,
                 (uint *)0xe40174,
                 (char (*) [14])
                 UploadSpaceIt.
                 super__Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
                 ._M_cur,(char **)
                         "\'. The texture has either been unmapped already or has not been mapped",
                 (char (*) [71])CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar5 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(2,uVar5,0);
      }
      std::__cxx11::string::~string((string *)local_88);
    }
  }
  else if ((((__node_type *)
            UploadSpaceIt.
            super__Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
            ._M_cur)->
           super__Hash_node_value<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
           ).
           super__Hash_node_value_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>_>
           ._M_storage._M_storage.__data[0x20] == USAGE_STAGING) {
    CVar3 = Diligent::operator&((((__node_type *)
                                 UploadSpaceIt.
                                 super__Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
                                 ._M_cur)->
                                super__Hash_node_value<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>_>
                                ._M_storage._M_storage.__data[0x21],CPU_ACCESS_READ);
    if (CVar3 == CPU_ACCESS_NONE) {
      Diligent::operator&(*(CPU_ACCESS_FLAGS *)
                           ((long)UploadSpaceIt.
                                  super__Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
                                  ._M_cur + 0x29),CPU_ACCESS_FLAG_LAST);
    }
  }
  else {
    local_c0 = GetUsageString((((__node_type *)
                               UploadSpaceIt.
                               super__Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
                               ._M_cur)->
                              super__Hash_node_value<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>_>
                              ._M_storage._M_storage.__data[0x20]);
    FormatString<char_const*,char[56]>
              ((string *)local_b8,(Diligent *)&local_c0,
               (char **)" textures cannot currently be mapped in Vulkan back-end",Args_1);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"UnmapTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb05);
    std::__cxx11::string::~string((string *)local_b8);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::UnmapTextureSubresource(ITexture* pTexture,
                                                  Uint32    MipLevel,
                                                  Uint32    ArraySlice)
{
    TDeviceContextBase::UnmapTextureSubresource(pTexture, MipLevel, ArraySlice);

    TextureVkImpl&     TextureVk = *ClassPtrCast<TextureVkImpl>(pTexture);
    const TextureDesc& TexDesc   = TextureVk.GetDesc();

    if (TexDesc.Usage == USAGE_DYNAMIC)
    {
        auto UploadSpaceIt = m_MappedTextures.find(MappedTextureKey{&TextureVk, MipLevel, ArraySlice});
        if (UploadSpaceIt != m_MappedTextures.end())
        {
            MappedTexture& MappedTex = UploadSpaceIt->second;
            CopyBufferToTexture(MappedTex.Allocation.pDynamicMemMgr->GetVkBuffer(),
                                MappedTex.Allocation.AlignedOffset,
                                MappedTex.CopyInfo.RowStrideInTexels,
                                TextureVk,
                                MappedTex.CopyInfo.Region,
                                MipLevel,
                                ArraySlice,
                                RESOURCE_STATE_TRANSITION_MODE_TRANSITION);
            m_MappedTextures.erase(UploadSpaceIt);
        }
        else
        {
            LOG_ERROR_MESSAGE("Failed to unmap mip level ", MipLevel, ", slice ", ArraySlice, " of texture '", TexDesc.Name, "'. The texture has either been unmapped already or has not been mapped");
        }
    }
    else if (TexDesc.Usage == USAGE_STAGING)
    {
        if (TexDesc.CPUAccessFlags & CPU_ACCESS_READ)
        {
            // Nothing needs to be done
        }
        else if (TexDesc.CPUAccessFlags & CPU_ACCESS_WRITE)
        {
            // Upload textures are currently created with VK_MEMORY_PROPERTY_HOST_COHERENT_BIT, so
            // there is no need to explicitly flush the mapped range.
        }
    }
    else
    {
        UNSUPPORTED(GetUsageString(TexDesc.Usage), " textures cannot currently be mapped in Vulkan back-end");
    }
}